

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  short sVar1;
  uint uVar2;
  sqlite3 *db;
  Op *pOVar3;
  Parse *pPVar4;
  ushort uVar5;
  int iVar6;
  Op *__s;
  Mem *pMVar7;
  Mem *pMVar8;
  int iVar9;
  Mem *pMVar10;
  Mem *pMVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  Mem *pMVar17;
  int nArg;
  uint local_98;
  int local_7c;
  ulong local_78;
  Parse *local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  db = p->db;
  uVar2 = pParse->nVar;
  local_60 = (ulong)(uint)pParse->nTab;
  local_7c = pParse->nMaxArg;
  uVar16 = pParse->nMem + pParse->nTab;
  local_68 = (ulong)(pParse->nOnce + (uint)(pParse->nOnce == 0));
  pOVar3 = p->aOp;
  iVar6 = p->nOp;
  __s = pOVar3 + iVar6;
  iVar9 = p->nOpAlloc;
  resolveP2Values(p,&local_7c);
  if (pParse->isMultiWrite == '\0') {
    uVar5 = 0;
  }
  else {
    uVar5 = (ushort)(pParse->mayAbort != '\0') << 7;
  }
  pMVar17 = (Mem *)(pOVar3 + iVar9);
  *(ushort *)&p->field_0x9a = uVar5 | *(ushort *)&p->field_0x9a & 0xff7f;
  uVar13 = 10;
  if (10 < (int)uVar16) {
    uVar13 = uVar16;
  }
  if (pParse->explain == '\0') {
    uVar13 = uVar16;
  }
  local_70 = pParse;
  memset(__s,0,(long)iVar9 * 0x18 + (long)iVar6 * -0x18);
  p->field_0x9a = p->field_0x9a & 0xdf;
  pMVar7 = (Mem *)(&__s->opcode + ((uint)__s & 7));
  local_38 = (long)(int)(uVar13 * 0x38);
  local_40 = (long)(int)(uVar2 * 0x38);
  iVar9 = local_7c * 8;
  local_48 = (long)iVar9;
  local_50 = (long)(int)(uVar2 * 8);
  iVar6 = (int)local_60 * 8;
  local_58 = (long)iVar6;
  uVar16 = (int)local_68 + 7;
  local_98 = uVar16 & 0xfffffff8;
  local_78 = (ulong)uVar13;
  do {
    if (p->aMem == (Mem *)0x0) {
      pMVar10 = (Mem *)((long)&pMVar7->db + local_38);
      if (pMVar17 < pMVar10) {
        pMVar8 = (Mem *)0x0;
        pMVar10 = pMVar7;
        iVar14 = uVar13 * 0x38;
      }
      else {
        iVar14 = 0;
        pMVar8 = pMVar7;
      }
    }
    else {
      pMVar8 = p->aMem;
      pMVar10 = pMVar7;
      iVar14 = 0;
    }
    p->aMem = pMVar8;
    pMVar8 = p->aVar;
    pMVar7 = pMVar10;
    if ((pMVar8 == (Mem *)0x0) &&
       (pMVar7 = (Mem *)((long)&pMVar10->db + local_40), pMVar8 = pMVar10, pMVar17 < pMVar7)) {
      iVar14 = iVar14 + uVar2 * 0x38;
      pMVar8 = (Mem *)0x0;
      pMVar7 = pMVar10;
    }
    p->aVar = pMVar8;
    pMVar10 = (Mem *)p->apArg;
    pMVar11 = pMVar7;
    if ((pMVar10 == (Mem *)0x0) &&
       (pMVar11 = (Mem *)((long)&pMVar7->db + local_48), pMVar10 = pMVar7, pMVar17 < pMVar11)) {
      iVar14 = iVar14 + iVar9;
      pMVar11 = pMVar7;
      pMVar10 = (Mem *)0x0;
    }
    p->apArg = (Mem **)pMVar10;
    pMVar7 = (Mem *)p->azVar;
    pMVar10 = pMVar11;
    if ((pMVar7 == (Mem *)0x0) &&
       (pMVar10 = (Mem *)((long)&pMVar11->db + local_50), pMVar7 = pMVar11, pMVar17 < pMVar10)) {
      iVar14 = iVar14 + uVar2 * 8;
      pMVar10 = pMVar11;
      pMVar7 = (Mem *)0x0;
    }
    p->azVar = (char **)pMVar7;
    pMVar7 = (Mem *)p->apCsr;
    pMVar11 = pMVar10;
    if ((pMVar7 == (Mem *)0x0) &&
       (pMVar11 = (Mem *)((long)&pMVar10->db + local_58), pMVar7 = pMVar10, pMVar17 < pMVar11)) {
      iVar14 = iVar14 + iVar6;
      pMVar11 = pMVar10;
      pMVar7 = (Mem *)0x0;
    }
    p->apCsr = (VdbeCursor **)pMVar7;
    if (pMVar17 < (Mem *)((long)&pMVar11->db + (long)(int)(uVar16 & 0xfffffff8))) {
      pMVar11 = (Mem *)0x0;
      uVar15 = local_98;
    }
    else {
      uVar15 = 0;
    }
    if ((Mem *)p->aOnceFlag != (Mem *)0x0) {
      pMVar11 = (Mem *)p->aOnceFlag;
      uVar15 = 0;
    }
    p->aOnceFlag = (u8 *)pMVar11;
    iVar14 = iVar14 + uVar15;
    if (iVar14 == 0) goto LAB_00123441;
    pMVar7 = (Mem *)sqlite3DbMallocRaw(db,iVar14);
    if (pMVar7 != (Mem *)0x0) {
      memset(pMVar7,0,(long)iVar14);
    }
    p->pFree = pMVar7;
    pMVar17 = (Mem *)((long)&pMVar7->db + (long)iVar14);
  } while (db->mallocFailed == '\0');
  pMVar8 = p->aVar;
LAB_00123441:
  pPVar4 = local_70;
  p->nCursor = (int)local_60;
  p->nOnceFlag = (int)local_68;
  if ((pMVar8 != (Mem *)0x0) && (p->nVar = (ynVar)uVar2, 0 < (int)uVar2)) {
    lVar12 = 0;
    do {
      *(undefined2 *)((long)&pMVar8->flags + lVar12) = 1;
      *(sqlite3 **)((long)&pMVar8->db + lVar12) = db;
      lVar12 = lVar12 + 0x38;
    } while ((ulong)uVar2 * 0x38 - lVar12 != 0);
  }
  if (p->azVar != (char **)0x0) {
    sVar1 = (short)local_70->nzVar;
    p->nzVar = sVar1;
    memcpy(p->azVar,local_70->azVar,(long)sVar1 << 3);
    memset(pPVar4->azVar,0,(long)pPVar4->nzVar << 3);
  }
  pMVar17 = p->aMem;
  if (pMVar17 != (Mem *)0x0) {
    p->aMem = pMVar17 + -1;
    iVar6 = (int)local_78;
    p->nMem = iVar6;
    if (0 < iVar6) {
      lVar12 = 0;
      do {
        *(undefined2 *)((long)&pMVar17->flags + lVar12) = 0x80;
        *(sqlite3 **)((long)&pMVar17->db + lVar12) = db;
        lVar12 = lVar12 + 0x38;
      } while ((ulong)(iVar6 + 1) * 0x38 + -0x38 != lVar12);
    }
  }
  *(ushort *)&p->field_0x9a = *(ushort *)&p->field_0x9a & 0xfffc | local_70->explain & 3;
  p->rc = 0;
  p->errorAction = '\x02';
  p->minWriteFileFormat = 0xff;
  p->magic = 0xbdf20da3;
  p->nChange = 0;
  p->cacheCtr = 1;
  p->pc = -1;
  p->iStatement = 0;
  p->nFkConstraint = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int nOnce;                     /* Number of OP_Once instructions */
  int n;                         /* Loop counter */
  u8 *zCsr;                      /* Memory available for allocation */
  u8 *zEnd;                      /* First byte past allocated memory */
  int nByte;                     /* How much extra memory is needed */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;
  nOnce = pParse->nOnce;
  if( nOnce==0 ) nOnce = 1; /* Ensure at least one byte in p->aOnceFlag[] */
  
  /* For each cursor required, also allocate a memory cell. Memory
  ** cells (nMem+1-nCursor)..nMem, inclusive, will never be used by
  ** the vdbe program. Instead they are used to allocate space for
  ** VdbeCursor/BtCursor structures. The blob of memory associated with 
  ** cursor 0 is stored in memory cell nMem. Memory cell (nMem-1)
  ** stores the blob of memory associated with cursor 1, etc.
  **
  ** See also: allocateCursor().
  */
  nMem += nCursor;

  /* Allocate space for memory registers, SQL variables, VDBE cursors and 
  ** an array to marshal SQL function arguments in.
  */
  zCsr = (u8*)&p->aOp[p->nOp];       /* Memory avaliable for allocation */
  zEnd = (u8*)&p->aOp[p->nOpAlloc];  /* First byte past end of zCsr[] */

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain && nMem<10 ){
    nMem = 10;
  }
  memset(zCsr, 0, zEnd-zCsr);
  zCsr += (zCsr - (u8*)0)&7;
  assert( EIGHT_BYTE_ALIGNMENT(zCsr) );
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in two
  ** passes.  On the first pass, we try to reuse unused space at the 
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the rest using a fresh allocation.  
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover space at the end of the opcode array can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  do {
    nByte = 0;
    p->aMem = allocSpace(p->aMem, nMem*sizeof(Mem), &zCsr, zEnd, &nByte);
    p->aVar = allocSpace(p->aVar, nVar*sizeof(Mem), &zCsr, zEnd, &nByte);
    p->apArg = allocSpace(p->apArg, nArg*sizeof(Mem*), &zCsr, zEnd, &nByte);
    p->azVar = allocSpace(p->azVar, nVar*sizeof(char*), &zCsr, zEnd, &nByte);
    p->apCsr = allocSpace(p->apCsr, nCursor*sizeof(VdbeCursor*),
                          &zCsr, zEnd, &nByte);
    p->aOnceFlag = allocSpace(p->aOnceFlag, nOnce, &zCsr, zEnd, &nByte);
    if( nByte ){
      p->pFree = sqlite3DbMallocZero(db, nByte);
    }
    zCsr = p->pFree;
    zEnd = &zCsr[nByte];
  }while( nByte && !db->mallocFailed );

  p->nCursor = nCursor;
  p->nOnceFlag = nOnce;
  if( p->aVar ){
    p->nVar = (ynVar)nVar;
    for(n=0; n<nVar; n++){
      p->aVar[n].flags = MEM_Null;
      p->aVar[n].db = db;
    }
  }
  if( p->azVar ){
    p->nzVar = pParse->nzVar;
    memcpy(p->azVar, pParse->azVar, p->nzVar*sizeof(p->azVar[0]));
    memset(pParse->azVar, 0, pParse->nzVar*sizeof(pParse->azVar[0]));
  }
  if( p->aMem ){
    p->aMem--;                      /* aMem[] goes from 1..nMem */
    p->nMem = nMem;                 /*       not from 0..nMem-1 */
    for(n=1; n<=nMem; n++){
      p->aMem[n].flags = MEM_Invalid;
      p->aMem[n].db = db;
    }
  }
  p->explain = pParse->explain;
  sqlite3VdbeRewind(p);
}